

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

void __thiscall re2::DFA::RWLocker::LockForWriting(RWLocker *this)

{
  RWLocker *this_local;
  
  if ((this->writing_ & 1U) == 0) {
    Mutex::ReaderUnlock(this->mu_);
    Mutex::Lock(this->mu_);
    this->writing_ = true;
  }
  return;
}

Assistant:

void DFA::RWLocker::LockForWriting() NO_THREAD_SAFETY_ANALYSIS {
  if (!writing_) {
    mu_->ReaderUnlock();
    mu_->Lock();
    writing_ = true;
  }
}